

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_create(REF_AGENTS *ref_agents_ptr,REF_MPI ref_mpi)

{
  REF_AGENTS pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  int local_2c;
  REF_INT id;
  REF_AGENTS ref_agents;
  REF_MPI ref_mpi_local;
  REF_AGENTS *ref_agents_ptr_local;
  
  pRVar1 = (REF_AGENTS)malloc(0x20);
  *ref_agents_ptr = pRVar1;
  if (*ref_agents_ptr == (REF_AGENTS)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x24,
           "ref_agents_create","malloc *ref_agents_ptr of REF_AGENTS_STRUCT NULL");
    ref_agents_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_agents_ptr;
    pRVar1->ref_mpi = ref_mpi;
    pRVar1->n = 0;
    pRVar1->max = 10;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x2c
             ,"ref_agents_create","malloc ref_agents->agent of REF_AGENT_STRUCT negative");
      ref_agents_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_AGENT_STRUCT *)malloc((long)pRVar1->max * 0x68);
      pRVar1->agent = pRVar2;
      if (pRVar1->agent == (REF_AGENT_STRUCT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0x2c,"ref_agents_create","malloc ref_agents->agent of REF_AGENT_STRUCT NULL");
        ref_agents_ptr_local._4_4_ = 2;
      }
      else {
        for (local_2c = 0; local_2c < pRVar1->max; local_2c = local_2c + 1) {
          pRVar1->agent[local_2c].mode = REF_AGENT_UNUSED;
          pRVar1->agent[local_2c].previous = -1;
          pRVar1->agent[local_2c].next = local_2c + 1;
        }
        pRVar1->agent[pRVar1->max + -1].next = -1;
        pRVar1->blank = 0;
        pRVar1->last = -1;
        ref_agents_ptr_local._4_4_ = 0;
      }
    }
  }
  return ref_agents_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_create(REF_AGENTS *ref_agents_ptr,
                                     REF_MPI ref_mpi) {
  REF_AGENTS ref_agents;
  REF_INT id;

  ref_malloc(*ref_agents_ptr, 1, REF_AGENTS_STRUCT);
  ref_agents = (*ref_agents_ptr);

  ref_agents->ref_mpi = ref_mpi;

  ref_agents->n = 0;
  ref_agents->max = 10;

  ref_malloc(ref_agents->agent, ref_agents->max, REF_AGENT_STRUCT);

  for (id = 0; id < ref_agents->max; id++) {
    ref_agent_mode(ref_agents, id) = REF_AGENT_UNUSED;
    ref_agent_previous(ref_agents, id) = REF_EMPTY;
    ref_agent_next(ref_agents, id) = id + 1;
  }
  ref_agent_next(ref_agents, ref_agents_max(ref_agents) - 1) = REF_EMPTY;
  ref_agents->blank = 0;
  ref_agents->last = REF_EMPTY;

  return REF_SUCCESS;
}